

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

QLayoutStyleInfo * __thiscall
QGraphicsAnchorLayoutPrivate::styleInfo(QGraphicsAnchorLayoutPrivate *this)

{
  double dVar1;
  bool bVar2;
  QGraphicsLayoutItem *this_00;
  QGraphicsItem *this_01;
  QStyle *style;
  long in_FS_OFFSET;
  QLayoutStyleInfo local_80;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x2c0 & 2) == 0) goto LAB_0055e201;
  this_00 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  do {
    this_00 = QGraphicsLayoutItem::parentLayoutItem(this_00);
    if (this_00 == (QGraphicsLayoutItem *)0x0) goto LAB_0055e19a;
    bVar2 = QGraphicsLayoutItem::isLayout(this_00);
  } while (bVar2);
  this_01 = QGraphicsLayoutItem::graphicsItem(this_00);
  if (this_01 == (QGraphicsItem *)0x0) {
LAB_0055e19a:
    style = QApplication::style();
  }
  else {
    bVar2 = QGraphicsItem::isWidget(this_01);
    if (!bVar2) goto LAB_0055e19a;
    style = QGraphicsWidget::style((QGraphicsWidget *)(this_01 + -1));
  }
  QLayoutStyleInfo::QLayoutStyleInfo(&local_80,style,(QWidget *)0x0);
  QLayoutStyleInfo::operator=(&this->cachedStyleInfo,&local_80);
  QStyleOption::~QStyleOption(&local_80.m_styleOption);
  dVar1 = (this->spacings).m_data[0];
  if (0.0 <= dVar1) {
    (this->cachedStyleInfo).m_defaultSpacing[0] = dVar1;
  }
  dVar1 = (this->spacings).m_data[1];
  if (0.0 <= dVar1) {
    (this->cachedStyleInfo).m_defaultSpacing[1] = dVar1;
  }
  this->field_0x2c0 = this->field_0x2c0 & 0xfd;
LAB_0055e201:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return &this->cachedStyleInfo;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutStyleInfo &QGraphicsAnchorLayoutPrivate::styleInfo() const
{
    if (styleInfoDirty) {
        Q_Q(const QGraphicsAnchorLayout);
        //### Fix this if QGV ever gets support for Metal style or different Aqua sizes.
        QWidget *wid = nullptr;

        QGraphicsLayoutItem *parent = q->parentLayoutItem();
        while (parent && parent->isLayout()) {
            parent = parent->parentLayoutItem();
        }
        QGraphicsWidget *w = nullptr;
        if (parent) {
            QGraphicsItem *parentItem = parent->graphicsItem();
            if (parentItem && parentItem->isWidget())
                w = static_cast<QGraphicsWidget*>(parentItem);
        }

        QStyle *style = w ? w->style() : QApplication::style();
        cachedStyleInfo = QLayoutStyleInfo(style, wid);
        cachedStyleInfo.setDefaultSpacing(Qt::Horizontal, spacings[Qt::Horizontal]);
        cachedStyleInfo.setDefaultSpacing(Qt::Vertical, spacings[Qt::Vertical]);

        styleInfoDirty = false;
    }
    return cachedStyleInfo;
}